

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

double __thiscall Graph::minVoltage(Graph *this)

{
  Vertex *pVVar1;
  double dVar2;
  double dVar3;
  
  pVVar1 = this->verticesList;
  if (pVVar1 != (Vertex *)0x0) {
    dVar3 = 1.0;
    do {
      dVar2 = pVVar1->voltage;
      if (dVar3 <= pVVar1->voltage) {
        dVar2 = dVar3;
      }
      pVVar1 = pVVar1->nextVertex;
      dVar3 = dVar2;
    } while (pVVar1 != (Vertex *)0x0);
    return dVar2;
  }
  return 1.0;
}

Assistant:

double Graph::minVoltage(){
    double tension_minimum = 1.0;
    for(Vertex *no=this->verticesList; no!=NULL; no= no->getNext()){
        if(no->getVoltage() < tension_minimum)
            tension_minimum = no->getVoltage();
    }
    return tension_minimum;
}